

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O1

void bench_ecmult_multi_teardown(void *arg,int iters)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  secp256k1_fe *in_RCX;
  long extraout_RDX;
  uint uVar5;
  int iVar6;
  secp256k1_gej *psVar7;
  long lVar8;
  secp256k1_ge *psVar9;
  secp256k1_gej *psVar10;
  ulong uVar11;
  secp256k1_gej *b;
  secp256k1_gej *a;
  byte bVar12;
  secp256k1_gej tmp;
  secp256k1_gej local_b0;
  
  bVar12 = 0;
  uVar5 = (uint)((ulong)(long)iters / *(ulong *)((long)arg + 0x40));
  if (0 < (int)uVar5) {
    b = *(secp256k1_gej **)((long)arg + 0x30);
    a = *(secp256k1_gej **)((long)arg + 0x60);
    uVar11 = 0;
    do {
      psVar7 = a;
      psVar10 = &local_b0;
      secp256k1_gej_add_var(&local_b0,a,b,in_RCX);
      if (local_b0.infinity == 0) {
        bench_ecmult_multi_teardown_cold_1();
        uVar2 = in_RCX->n[2];
        lVar8 = (ulong)((int)in_RCX[1].n[4] != 0) + extraout_RDX;
        if (lVar8 == 0) {
          lVar8 = in_RCX[2].n[0] * 0x20;
          puVar1 = (uint64_t *)(uVar2 + lVar8);
          uVar3 = *puVar1;
          uVar4 = puVar1[1];
          puVar1 = (uint64_t *)(uVar2 + 0x10 + lVar8);
          uVar2 = puVar1[1];
          (psVar10->x).n[2] = *puVar1;
          (psVar10->x).n[3] = uVar2;
          (psVar10->x).n[0] = uVar3;
          (psVar10->x).n[1] = uVar4;
          psVar9 = &secp256k1_ge_const_g;
        }
        else {
          iVar6 = (int)lVar8;
          uVar11 = (ulong)(((int)in_RCX[2].n[0] + iVar6 & 0x7fffU) << 5);
          puVar1 = (uint64_t *)(uVar2 + uVar11);
          uVar3 = *puVar1;
          uVar4 = puVar1[1];
          puVar1 = (uint64_t *)(uVar2 + 0x10 + uVar11);
          uVar2 = puVar1[1];
          (psVar10->x).n[2] = *puVar1;
          (psVar10->x).n[3] = uVar2;
          (psVar10->x).n[0] = uVar3;
          (psVar10->x).n[1] = uVar4;
          psVar9 = (secp256k1_ge *)
                   ((ulong)((iVar6 + (int)in_RCX[2].n[1]) - 1U & 0x7fff) * 0x58 + in_RCX->n[3]);
        }
        for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
          (psVar7->x).n[0] = (psVar9->x).n[0];
          psVar9 = (secp256k1_ge *)((long)psVar9 + ((ulong)bVar12 * -2 + 1) * 8);
          psVar7 = (secp256k1_gej *)((long)psVar7 + (ulong)bVar12 * -0x10 + 8);
        }
        return;
      }
      uVar11 = uVar11 + 1;
      b = b + 1;
      a = a + 1;
    } while (uVar11 < (uVar5 & 0x7fffffff));
  }
  return;
}

Assistant:

static void bench_ecmult_multi_teardown(void* arg, int iters) {
    bench_data* data = (bench_data*)arg;
    int iter;
    iters = iters / data->count;
    /* Verify the results in teardown, to avoid doing comparisons while benchmarking. */
    for (iter = 0; iter < iters; ++iter) {
        secp256k1_gej tmp;
        secp256k1_gej_add_var(&tmp, &data->output[iter], &data->expected_output[iter], NULL);
        CHECK(secp256k1_gej_is_infinity(&tmp));
    }
}